

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

FindInfo absl::lts_20250127::container_internal::find_first_non_full<void>
                   (CommonFields *common,size_t hash)

{
  ctrl_t *pcVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  ushort uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [12];
  undefined1 auVar14 [13];
  undefined1 auVar15 [14];
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long *in_FS_OFFSET;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  FindInfo FVar22;
  
  uVar2 = common->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  pcVar3 = (common->heap_or_soo_).heap.control;
  uVar20 = (ulong)pcVar3 >> 0xc;
  uVar19 = hash >> 7;
  uVar17 = (uVar20 ^ uVar19) & uVar2;
  if ((pcVar3[uVar17] < kSentinel) &&
     ((uVar2 < 0xf ||
      (lVar18 = in_FS_OFFSET[-6], in_FS_OFFSET[-6] = lVar18 + 1U,
      (lVar18 + 1U ^ uVar20 ^ *in_FS_OFFSET - 0x30U ^ uVar19) % 0xd < 7)))) {
    uVar21 = 0;
  }
  else {
    uVar21 = 0;
    while( true ) {
      pcVar1 = pcVar3 + uVar17;
      iVar8 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                     CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar1 < (ctrl_t)iVar8);
      in_XMM1_Bb = -(pcVar1[1] < (ctrl_t)((uint)iVar8 >> 8));
      in_XMM1_Bc = -(pcVar1[2] < (ctrl_t)((uint)iVar8 >> 0x10));
      in_XMM1_Bd = -(pcVar1[3] < (ctrl_t)((uint)iVar8 >> 0x18));
      in_XMM1_Be = -(pcVar1[4] < (ctrl_t)iVar9);
      in_XMM1_Bf = -(pcVar1[5] < (ctrl_t)((uint)iVar9 >> 8));
      in_XMM1_Bg = -(pcVar1[6] < (ctrl_t)((uint)iVar9 >> 0x10));
      in_XMM1_Bh = -(pcVar1[7] < (ctrl_t)((uint)iVar9 >> 0x18));
      in_XMM1_Bi = -(pcVar1[8] < (ctrl_t)iVar10);
      in_XMM1_Bj = -(pcVar1[9] < (ctrl_t)((uint)iVar10 >> 8));
      in_XMM1_Bk = -(pcVar1[10] < (ctrl_t)((uint)iVar10 >> 0x10));
      in_XMM1_Bl = -(pcVar1[0xb] < (ctrl_t)((uint)iVar10 >> 0x18));
      in_XMM1_Bm = -(pcVar1[0xc] < (ctrl_t)iVar11);
      in_XMM1_Bn = -(pcVar1[0xd] < (ctrl_t)((uint)iVar11 >> 8));
      in_XMM1_Bo = -(pcVar1[0xe] < (ctrl_t)((uint)iVar11 >> 0x10));
      in_XMM1_Bp = -(pcVar1[0xf] < (ctrl_t)((uint)iVar11 >> 0x18));
      auVar6[1] = in_XMM1_Bb;
      auVar6[0] = in_XMM1_Ba;
      auVar6[2] = in_XMM1_Bc;
      auVar6[3] = in_XMM1_Bd;
      auVar6[4] = in_XMM1_Be;
      auVar6[5] = in_XMM1_Bf;
      auVar6[6] = in_XMM1_Bg;
      auVar6[7] = in_XMM1_Bh;
      auVar6[8] = in_XMM1_Bi;
      auVar6[9] = in_XMM1_Bj;
      auVar6[10] = in_XMM1_Bk;
      auVar6[0xb] = in_XMM1_Bl;
      auVar6[0xc] = in_XMM1_Bm;
      auVar6[0xd] = in_XMM1_Bn;
      auVar6[0xe] = in_XMM1_Bo;
      auVar6[0xf] = in_XMM1_Bp;
      auVar7[1] = in_XMM1_Bb;
      auVar7[0] = in_XMM1_Ba;
      auVar7[2] = in_XMM1_Bc;
      auVar7[3] = in_XMM1_Bd;
      auVar7[4] = in_XMM1_Be;
      auVar7[5] = in_XMM1_Bf;
      auVar7[6] = in_XMM1_Bg;
      auVar7[7] = in_XMM1_Bh;
      auVar7[8] = in_XMM1_Bi;
      auVar7[9] = in_XMM1_Bj;
      auVar7[10] = in_XMM1_Bk;
      auVar7[0xb] = in_XMM1_Bl;
      auVar7[0xc] = in_XMM1_Bm;
      auVar7[0xd] = in_XMM1_Bn;
      auVar7[0xe] = in_XMM1_Bo;
      auVar7[0xf] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Bd;
      auVar15[0] = in_XMM1_Bc;
      auVar15[2] = in_XMM1_Be;
      auVar15[3] = in_XMM1_Bf;
      auVar15[4] = in_XMM1_Bg;
      auVar15[5] = in_XMM1_Bh;
      auVar15[6] = in_XMM1_Bi;
      auVar15[7] = in_XMM1_Bj;
      auVar15[8] = in_XMM1_Bk;
      auVar15[9] = in_XMM1_Bl;
      auVar15[10] = in_XMM1_Bm;
      auVar15[0xb] = in_XMM1_Bn;
      auVar15[0xc] = in_XMM1_Bo;
      auVar15[0xd] = in_XMM1_Bp;
      auVar14[1] = in_XMM1_Be;
      auVar14[0] = in_XMM1_Bd;
      auVar14[2] = in_XMM1_Bf;
      auVar14[3] = in_XMM1_Bg;
      auVar14[4] = in_XMM1_Bh;
      auVar14[5] = in_XMM1_Bi;
      auVar14[6] = in_XMM1_Bj;
      auVar14[7] = in_XMM1_Bk;
      auVar14[8] = in_XMM1_Bl;
      auVar14[9] = in_XMM1_Bm;
      auVar14[10] = in_XMM1_Bn;
      auVar14[0xb] = in_XMM1_Bo;
      auVar14[0xc] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Bf;
      auVar13[0] = in_XMM1_Be;
      auVar13[2] = in_XMM1_Bg;
      auVar13[3] = in_XMM1_Bh;
      auVar13[4] = in_XMM1_Bi;
      auVar13[5] = in_XMM1_Bj;
      auVar13[6] = in_XMM1_Bk;
      auVar13[7] = in_XMM1_Bl;
      auVar13[8] = in_XMM1_Bm;
      auVar13[9] = in_XMM1_Bn;
      auVar13[10] = in_XMM1_Bo;
      auVar13[0xb] = in_XMM1_Bp;
      auVar12[1] = in_XMM1_Bg;
      auVar12[0] = in_XMM1_Bf;
      auVar12[2] = in_XMM1_Bh;
      auVar12[3] = in_XMM1_Bi;
      auVar12[4] = in_XMM1_Bj;
      auVar12[5] = in_XMM1_Bk;
      auVar12[6] = in_XMM1_Bl;
      auVar12[7] = in_XMM1_Bm;
      auVar12[8] = in_XMM1_Bn;
      auVar12[9] = in_XMM1_Bo;
      auVar12[10] = in_XMM1_Bp;
      uVar5 = (ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB141(auVar15 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar14 >> 7,0) & 1) << 3
              | (ushort)(SUB121(auVar13 >> 7,0) & 1) << 4 |
              (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
              (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                       CONCAT18(in_XMM1_Bo,
                                                CONCAT17(in_XMM1_Bn,
                                                         CONCAT16(in_XMM1_Bm,
                                                                  CONCAT15(in_XMM1_Bl,
                                                                           CONCAT14(in_XMM1_Bk,
                                                                                    CONCAT13(
                                                  in_XMM1_Bj,
                                                  CONCAT12(in_XMM1_Bi,
                                                           CONCAT11(in_XMM1_Bh,in_XMM1_Bg)))))))))
                             >> 7) & 1) << 6 |
              (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                       CONCAT17(in_XMM1_Bo,
                                                CONCAT16(in_XMM1_Bn,
                                                         CONCAT15(in_XMM1_Bm,
                                                                  CONCAT14(in_XMM1_Bl,
                                                                           CONCAT13(in_XMM1_Bk,
                                                                                    CONCAT12(
                                                  in_XMM1_Bj,CONCAT11(in_XMM1_Bi,in_XMM1_Bh))))))))
                             >> 7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf;
      if (uVar5 != 0) break;
      lVar18 = uVar17 + uVar21;
      uVar21 = uVar21 + 0x10;
      uVar17 = lVar18 + 0x10U & uVar2;
      if (uVar2 < uVar21) {
        __assert_fail("(seq.index() <= common.capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x724,
                      "FindInfo absl::container_internal::find_first_non_full(const CommonFields &, size_t)"
                     );
      }
    }
    if ((uVar2 < 0xf) ||
       (lVar18 = in_FS_OFFSET[-6], in_FS_OFFSET[-6] = lVar18 + 1U,
       (uVar20 ^ lVar18 + 1U ^ uVar19 ^ *in_FS_OFFSET - 0x30U) % 0xd < 7)) {
      uVar16 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
    }
    else {
      uVar4 = 0xf;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar16 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
    }
    uVar17 = uVar16 + uVar17 & uVar2;
  }
  FVar22.probe_length = uVar21;
  FVar22.offset = uVar17;
  return FVar22;
}

Assistant:

inline FindInfo find_first_non_full(const CommonFields& common, size_t hash) {
  auto seq = probe(common, hash);
  const ctrl_t* ctrl = common.control();
  if (IsEmptyOrDeleted(ctrl[seq.offset()]) &&
      !ShouldInsertBackwards(common.capacity(), hash, ctrl)) {
    return {seq.offset(), /*probe_length=*/0};
  }
  while (true) {
    GroupFullEmptyOrDeleted g{ctrl + seq.offset()};
    auto mask = g.MaskEmptyOrDeleted();
    if (mask) {
      return {
          seq.offset(GetInsertionOffset(mask, common.capacity(), hash, ctrl)),
          seq.index()};
    }
    seq.next();
    ABSL_SWISSTABLE_ASSERT(seq.index() <= common.capacity() && "full table!");
  }
}